

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

type __thiscall
jsoncons::jsonpath::detail::
static_resources<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>::
new_selector<jsoncons::jsonpath::detail::parent_node_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>>
          (static_resources<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>
           *this,parent_node_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *val)

{
  pointer *__ptr;
  _Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
  local_28;
  _Head_base<0UL,_jsoncons::jsonpath::detail::parent_node_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
  local_20;
  
  std::
  make_unique<jsoncons::jsonpath::detail::parent_node_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>,jsoncons::jsonpath::detail::parent_node_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>>
            ((parent_node_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)&stack0xffffffffffffffe0);
  local_28._M_head_impl =
       (jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        *)local_20._M_head_impl;
  local_20._M_head_impl =
       (parent_node_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        *)0x0;
  std::
  vector<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>,std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>>>,std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>,std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>>>>>
  ::
  emplace_back<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>,std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>>>>
            ((vector<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>,std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>>>,std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>,std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>>>>>
              *)(this + 0x20),
             (unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
              *)&local_28);
  if (local_28._M_head_impl !=
      (jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
       *)0x0) {
    (*(local_28._M_head_impl)->_vptr_jsonpath_selector[1])();
  }
  local_28._M_head_impl =
       (jsonpath_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        *)0x0;
  std::
  unique_ptr<jsoncons::jsonpath::detail::parent_node_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::parent_node_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  ::~unique_ptr((unique_ptr<jsoncons::jsonpath::detail::parent_node_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::parent_node_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
                 *)&stack0xffffffffffffffe0);
  return *(type *)(*(long *)(this + 0x28) + -8);
}

Assistant:

typename std::enable_if<std::is_const<typename std::remove_reference<typename T::reference>::type>::value,const_selector_type*>::type    
        new_selector(T&& val)
        {
            const_selectors_.push_back(jsoncons::make_unique<T>(std::forward<T>(val)));
            return const_selectors_.back().get();
        }